

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_split_edg(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  REF_CELL ref_cell;
  uint uVar1;
  REF_STATUS RVar2;
  void *__s;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  REF_CELL edg_split;
  REF_INT edge01;
  REF_INT new_cell;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  REF_CELL local_128;
  int local_120;
  REF_INT local_11c;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_a8;
  REF_INT local_a4 [29];
  
  ref_cell = ref_subdiv->grid->cell[0];
  iVar5 = ref_cell->max;
  if ((long)iVar5 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x553,
           "ref_subdiv_split_edg","malloc marked_for_removal of REF_INT negative");
    uVar1 = 1;
  }
  else {
    __size = (long)iVar5 * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x553,"ref_subdiv_split_edg","malloc marked_for_removal of REF_INT NULL");
      uVar1 = 2;
    }
    else {
      if (iVar5 != 0) {
        memset(__s,0,__size);
      }
      uVar1 = ref_cell_create(&local_128,ref_cell->type);
      if (uVar1 == 0) {
        if (0 < ref_cell->max) {
          lVar6 = 0;
          do {
            iVar5 = (int)lVar6;
            if (ref_cell->c2n[(long)iVar5 * (long)ref_cell->size_per] != -1) {
              uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_118);
              if (uVar1 != 0) {
                pcVar7 = "nodes";
                uVar4 = 0x558;
                goto LAB_001f1ba5;
              }
              uVar1 = ref_edge_with(ref_subdiv->edge,local_118,local_114,&local_120);
              if (uVar1 != 0) {
                pcVar7 = "e01";
                uVar4 = 0x55a;
                goto LAB_001f1ba5;
              }
              if (ref_subdiv->mark[local_120] != 0) {
                *(undefined4 *)((long)__s + lVar6 * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar7 = "nodes";
                  uVar4 = 0x55e;
                  goto LAB_001f1ba5;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                if (uVar1 != 0) {
                  pcVar7 = "mis";
                  uVar4 = 0x561;
                  goto LAB_001f1ba5;
                }
                uVar1 = ref_cell_add(local_128,&local_a8,&local_11c);
                if (uVar1 != 0) {
                  pcVar7 = "add";
                  uVar4 = 0x562;
                  goto LAB_001f1ba5;
                }
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar7 = "nodes";
                  uVar4 = 0x563;
                  goto LAB_001f1ba5;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,local_a4);
                if (uVar1 != 0) {
                  pcVar7 = "mis";
                  uVar4 = 0x566;
                  goto LAB_001f1ba5;
                }
                uVar1 = ref_cell_add(local_128,&local_a8,&local_11c);
                if (uVar1 != 0) {
                  pcVar7 = "add";
                  uVar4 = 0x567;
                  goto LAB_001f1ba5;
                }
              }
            }
            lVar6 = lVar6 + 1;
            uVar3 = (ulong)ref_cell->max;
          } while (lVar6 < (long)uVar3);
          if (0 < ref_cell->max) {
            lVar6 = 0;
            do {
              if (*(int *)((long)__s + lVar6 * 4) == 1) {
                uVar1 = ref_cell_remove(ref_cell,(REF_INT)lVar6);
                if (uVar1 != 0) {
                  pcVar7 = "remove";
                  uVar4 = 0x56d;
                  goto LAB_001f1ba5;
                }
                uVar3 = (ulong)(uint)ref_cell->max;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar3);
          }
        }
        if (0 < local_128->max) {
          iVar5 = 0;
          do {
            RVar2 = ref_cell_nodes(local_128,iVar5,&local_118);
            if ((RVar2 == 0) &&
               (uVar1 = ref_subdiv_add_local_cell((REF_SUBDIV)ref_subdiv->grid,ref_cell,&local_118),
               uVar1 != 0)) {
              pcVar7 = "add local";
              uVar4 = 0x570;
              goto LAB_001f1ba5;
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < local_128->max);
        }
        uVar1 = ref_cell_free(local_128);
        if (uVar1 == 0) {
          free(__s);
          return 0;
        }
        pcVar7 = "temp edg free";
        uVar4 = 0x572;
      }
      else {
        pcVar7 = "temp edg";
        uVar4 = 0x555;
      }
LAB_001f1ba5:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar4,"ref_subdiv_split_edg",(ulong)uVar1,pcVar7);
    }
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_edg(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL edg;
  REF_CELL edg_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01;

  edg = ref_grid_edg(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(edg), REF_INT, 0);

  RSS(ref_cell_create(&edg_split, ref_cell_type(edg)), "temp edg");

  each_ref_cell_valid_cell(edg, cell) {
    RSS(ref_cell_nodes(edg, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");

    if (ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(edg, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(edg_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(edg, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(edg_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(edg); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(edg, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(edg_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, edg, nodes), "add local");

  RSS(ref_cell_free(edg_split), "temp edg free");

  free(marked_for_removal);

  return REF_SUCCESS;
}